

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_604d5::data<float>::frak
          (data<float> *this,
          vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
          *parts)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *pvVar4;
  const_reference pvVar5;
  value_type *pvVar6;
  vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
  *in_RSI;
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000028;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000030;
  int part;
  size_t s;
  size_t i_1;
  size_t i;
  reference in_stack_ffffffffffffff90;
  value_type *__x;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *this_00;
  undefined4 in_stack_ffffffffffffffb0;
  PixelType PVar7;
  value_type *local_28;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_20;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    sVar2 = std::
            vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
            ::size(in_RSI);
    if (sVar2 <= local_18) break;
    std::
    vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
    ::operator[](in_RSI,local_18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_00000030,in_stack_00000028);
    sVar2 = in_RDI + 0x30;
    std::
    vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
    ::operator[](in_RSI,local_18);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::operator=((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 *)in_stack_00000030,
                (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 *)in_stack_00000028);
    PVar7 = *(PixelType *)(in_RDI + 0x98);
    pvVar3 = std::
             vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
             ::operator[](in_RSI,local_18);
    pvVar3->_type = PVar7;
    std::
    vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
    ::operator[](in_RSI,local_18);
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::size((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
            *)(in_RDI + 0x80));
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::resize((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
              *)CONCAT44(PVar7,in_stack_ffffffffffffffb0),sVar2);
    local_18 = local_18 + 1;
  }
  local_20 = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)0x0;
  while( true ) {
    this_00 = local_20;
    pvVar4 = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)std::
                vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                ::size((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                        *)(in_RDI + 0x80));
    if (pvVar4 <= this_00) break;
    local_28 = (value_type *)0x0;
    while( true ) {
      __x = local_28;
      pvVar5 = std::
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                             *)(in_RDI + 0x80),(size_type)local_20);
      pvVar6 = (value_type *)
               std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::size(pvVar5);
      iVar1 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
      if (pvVar6 <= __x) break;
      std::
      vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
      ::size(in_RSI);
      iVar1 = random_int(iVar1);
      pvVar3 = std::
               vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
               ::operator[](in_RSI,(long)iVar1);
      in_stack_ffffffffffffff90 =
           std::
           vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
           ::operator[](&pvVar3->_samples,(size_type)local_20);
      pvVar5 = std::
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                             *)(in_RDI + 0x80),(size_type)local_20);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[](pvVar5,(size_type)local_28);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::push_back(this_00,__x);
      local_28 = (value_type *)
                 ((long)&(local_28->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    }
    local_20 = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *)((long)&(local_20->
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void frak (vector<data<T>>& parts) const
    {
        for (size_t i = 0; i < parts.size (); i++)
        {
            parts[i]._channels = _channels;
            parts[i]._results  = _results;
            parts[i]._type     = _type;
            parts[i]._samples.resize (_samples.size ());
        }

        //
        // loop over each pixel, pushing its values to a random part
        //
        for (size_t i = 0; i < _samples.size (); i++)
        {
            // copy sample to a random part

            for (size_t s = 0; s < _samples[i].size (); s++)
            {
                int part = random_int (parts.size ());
                parts[part]._samples[i].push_back (_samples[i][s]);
            }
        }
    }